

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall UKF::PredictMeanAndCovariance(UKF *this,MatrixXd *Xsig_pred,VectorXd *x,MatrixXd *P)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  ActualDstType actualDst_1;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *pPVar15;
  Index index;
  ulong uVar16;
  ActualDstType actualDst;
  long lVar17;
  double dVar18;
  VectorXd x_diff;
  assign_op<double,_double> local_d1;
  void *local_d0;
  double local_c8;
  undefined1 local_c0 [16];
  scalar_constant_op<double> local_b0;
  MatrixXd *local_a8;
  scalar_constant_op<double> local_a0;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_98;
  ulong local_90;
  RhsNested local_88;
  ulong local_80;
  MatrixXd *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  double local_48;
  undefined8 uStack_40;
  
  lVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar12 < 0) {
    pcVar14 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    if (lVar12 != 0) {
      memset((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
             lVar12 << 3);
    }
    if (0 < this->n_sigma_) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar13) goto LAB_00105b64;
        pdVar4 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        uVar5 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        if ((long)uVar5 < 0 && pdVar4 != (double *)0x0) goto LAB_00105ba2;
        if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar13) goto LAB_00105b83;
        if ((long)uVar5 < 0) {
          pcVar14 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_00105c0c;
        }
        if ((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
            uVar5) {
          pcVar14 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_00105c2b;
        }
        uVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        ;
        if (uVar6 != uVar5) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>, T1 = double, T2 = double]"
                       );
        }
        dVar18 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar13];
        pdVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar16 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar6) {
          lVar17 = 0;
          do {
            pdVar1 = pdVar7 + lVar17;
            dVar10 = pdVar1[1];
            pdVar2 = (double *)((long)pdVar4 + lVar17 * 8 + uVar5 * lVar12);
            dVar11 = pdVar2[1];
            pdVar3 = pdVar8 + lVar17;
            *pdVar3 = *pdVar2 * dVar18 + *pdVar1;
            pdVar3[1] = dVar11 * dVar18 + dVar10;
            lVar17 = lVar17 + 2;
          } while (lVar17 < (long)uVar16);
        }
        if ((long)uVar16 < (long)uVar6) {
          do {
            pdVar8[uVar16] =
                 *(double *)((long)pdVar4 + uVar16 * 8 + uVar5 * lVar12) * dVar18 + pdVar7[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar6 != uVar16);
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 8;
      } while (lVar13 < this->n_sigma_);
    }
    local_c0._0_8_ =
         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_c0._8_8_ =
         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    local_b0.m_other = 0.0;
    if (-1 < (long)(local_c0._8_8_ | local_c0._0_8_)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (P,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_c0,(assign_op<double,_double> *)&local_d0);
      if (1 < this->n_sigma_) {
        pPVar15 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x1;
        do {
          pPVar9 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                   (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          uVar5 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          if ((long)uVar5 < 0 && pPVar9 != (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)0x0
             ) {
LAB_00105ba2:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                         );
          }
          if ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols <= (long)pPVar15) {
LAB_00105b83:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          local_c0._0_8_ = pPVar9 + uVar5 * (long)pPVar15 * 8;
          local_a0.m_other = 0.0;
          local_68 = 0;
          uStack_60 = 0;
          local_c0._8_8_ = uVar5;
          local_a8 = Xsig_pred;
          local_98 = pPVar15;
          local_90 = uVar5;
          local_88.m_matrix = (non_const_type)pPVar9;
          local_80 = uVar5;
          local_70 = Xsig_pred;
          local_58 = uVar5;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d0,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                      *)local_c0);
          if ((long)local_c8 < 4) {
LAB_00105b64:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_48 = (double)((ulong)*(double *)((long)local_d0 + 0x18) & 0x8000000000000000 |
                             0x400921fb54442d18);
          uStack_40 = 0x400921fb54442d18;
          dVar18 = fmod(*(double *)((long)local_d0 + 0x18) + local_48,6.283185307179586);
          if (((long)local_c8 < 4) ||
             (*(double *)((long)local_d0 + 0x18) = dVar18 - local_48,
             (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows <= (long)pPVar15)) goto LAB_00105b64;
          local_a0.m_other =
               (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[(long)pPVar15];
          local_b0.m_other = local_c8;
          local_c0._0_8_ = P;
          local_98 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_d0;
          local_88.m_matrix = (non_const_type)&local_d0;
          if (((double)(P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows != local_c8) ||
             ((double)(P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols != local_c8)) {
            pcVar14 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>]"
            ;
LAB_00105c2b:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar14);
          }
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>const>,Eigen::internal::assign_op<double,double>>
                    (P,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                        *)local_c0,&local_d1,(type)0x0);
          free(local_d0);
          pPVar15 = pPVar15 + 1;
        } while ((long)pPVar15 < (long)this->n_sigma_);
      }
      return;
    }
    pcVar14 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
LAB_00105c0c:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar14);
}

Assistant:

void UKF::PredictMeanAndCovariance(const MatrixXd &Xsig_pred, VectorXd &x, MatrixXd &P) {

  //predicted state mean
  x.fill(0.0);
  for (int i = 0; i < n_sigma_; i++) {  //iterate over sigma points
    x = x + weights_(i) * Xsig_pred.col(i);
  }

  ////predicted state covariance matrix
  //P.fill(0.0);
  //for (int i = 0; i < n_sigma_; i++) {  //iterate over sigma points
  //
  //  // state difference
  //  VectorXd x_diff = Xsig_pred.col(i) - x;
  //  x_diff(3) = normalizeRadiansPiToMinusPi(x_diff(3));
  //
  //  P = P + weights_(i) * x_diff * x_diff.transpose();
  //}

  //predicted state covariance matrix
  P.fill(0.0);
  for (int i = 1; i < n_sigma_; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred.col(i) - Xsig_pred.col(0);
    x_diff(3) = normalizeRadiansPiToMinusPi(x_diff(3));

    P = P + weights_(i) * x_diff * x_diff.transpose();
  }
}